

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_digest.c
# Opt level: O1

void warn_all_untested(void)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  ENGINE *e;
  ENGINE_DIGESTS_PTR pEVar5;
  EVP_MD *pEVar6;
  long lVar7;
  size_t __n;
  size_t sVar8;
  HMAC_CTX *ctx;
  EVP_MD_CTX *pEVar9;
  undefined8 uVar10;
  long lVar11;
  void *pvVar12;
  EVP_MD_CTX *ctx_00;
  uint uVar13;
  ENGINE *unaff_RBX;
  size_t sVar14;
  ulong uVar15;
  ulong uVar16;
  hash_testvec *phVar17;
  char *pcVar18;
  char *pcVar19;
  char *pcVar20;
  char **__s;
  uchar *puVar21;
  ulong uVar22;
  char *pcVar23;
  void *d;
  int *nids;
  EVP_MD *pEStack_280;
  EVP_MD *pEStack_278;
  ulong uStack_260;
  size_t sStack_258;
  void *pvStack_250;
  hash_testvec *phStack_248;
  long lStack_240;
  uint uStack_238;
  uint uStack_234;
  ulong uStack_230;
  void *pvStack_228;
  char *pcStack_220;
  long lStack_218;
  int *piStack_210;
  char *pcStack_208;
  undefined8 uStack_200;
  undefined4 uStack_1f8;
  undefined4 uStack_1f4;
  char *pcStack_1f0;
  char *pcStack_1e8;
  char *pcStack_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 uStack_1c0;
  undefined8 uStack_1b8;
  uint auStack_100 [10];
  char *pcStack_d8;
  undefined8 uStack_d0;
  char *pcStack_c8;
  char *pcStack_c0;
  char *pcStack_b8;
  char *apcStack_b0 [11];
  ENGINE *pEStack_58;
  int *local_20;
  
  iVar2 = engine_is_available("gost");
  e = unaff_RBX;
  if (iVar2 == 0) {
LAB_001036ba:
    iVar2 = OSSL_PROVIDER_available(0,"gostprov");
    if (iVar2 == 0) {
      return;
    }
    lVar7 = OSSL_PROVIDER_load(0,"gostprov");
    if (lVar7 != 0) {
      EVP_MD_do_all_provided(0,warn_if_untested,lVar7);
      OSSL_PROVIDER_unload(lVar7);
      return;
    }
LAB_00103753:
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("prov = OSSL_PROVIDER_load(NULL, \"gostprov\")",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
                ,0x3b3);
  }
  else {
    e = ENGINE_by_id("gost");
    if (e == (ENGINE *)0x0) {
      ERR_print_errors_fp(_stderr);
      OPENSSL_die("eng = ENGINE_by_id(\"gost\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
                  ,0x3a3);
LAB_0010372c:
      ERR_print_errors_fp(_stderr);
      OPENSSL_die("ENGINE_init(eng)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
                  ,0x3a4);
      e = unaff_RBX;
      goto LAB_00103753;
    }
    iVar2 = ENGINE_init(e);
    unaff_RBX = e;
    if (iVar2 == 0) goto LAB_0010372c;
    pEVar5 = ENGINE_get_digests(e);
    if (pEVar5 != (ENGINE_DIGESTS_PTR)0x0) {
      uVar3 = (*pEVar5)(e,(EVP_MD **)0x0,&local_20,0);
      if (0 < (int)uVar3) {
        uVar22 = 0;
        do {
          pEVar6 = ENGINE_get_digest(e,local_20[uVar22]);
          warn_if_untested((EVP_MD *)pEVar6,(void *)0x0);
          uVar22 = uVar22 + 1;
        } while (uVar3 != uVar22);
      }
      ENGINE_finish(e);
      ENGINE_free(e);
      goto LAB_001036ba;
    }
  }
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("fn_c = ENGINE_get_digests(eng)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x3a7);
  pEStack_58 = e;
  OPENSSL_init_crypto(0x4c,0);
  phVar17 = testvecs;
  pcVar20 = "md_gost12_512";
  uStack_238 = 0;
  while (pcStack_208 = phVar17->plaintext, phStack_248 = phVar17, pcStack_208 == (char *)0x0) {
    printf("\x1b[1;34mTest %s: \x1b[m",phVar17->name);
    fflush(_stdout);
    uVar22 = 0;
    do {
      pvVar12 = (void *)CRYPTO_zalloc(uVar22 | 0x100,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
                                      ,0x324);
      if (pvVar12 == (void *)0x0) goto LAB_00104772;
      uStack_200 = (char *)((ulong)uStack_200 & 0xffffffff00000000);
      d = (void *)((long)pvVar12 + uVar22);
      uVar3 = 0;
      do {
        *(char *)((long)d + (ulong)uVar3) = (char)uVar3;
        uVar3 = (uint)uStack_200 + 1;
        uStack_200 = (char *)CONCAT44(uStack_200._4_4_,uVar3);
      } while (uVar3 < 0x100);
      pEStack_280 = EVP_get_digestbyname(pcVar20);
      if ((pEStack_280 == (EVP_MD *)0x0) &&
         (pEStack_280 = (EVP_MD *)EVP_MD_fetch(0,pcVar20,0), pEStack_280 == (EVP_MD *)0x0))
      goto LAB_00104ac0;
      iVar2 = EVP_MD_is_a(pEStack_280,pcVar20);
      if (iVar2 == 0) goto LAB_00104799;
      pEVar9 = (EVP_MD_CTX *)EVP_MD_CTX_new();
      if (pEVar9 == (EVP_MD_CTX *)0x0) goto LAB_001047b1;
      ctx_00 = (EVP_MD_CTX *)EVP_MD_CTX_new();
      if (ctx_00 == (EVP_MD_CTX *)0x0) goto LAB_001047d8;
      iVar2 = EVP_DigestInit(ctx_00,pEStack_280);
      if (iVar2 == 0) goto LAB_001047ff;
      pEVar6 = EVP_MD_CTX_md(ctx_00);
      iVar2 = EVP_MD_is_a(pEVar6,pcVar20);
      if (iVar2 == 0) goto LAB_00104826;
      iVar4 = EVP_MD_get_block_size(pEStack_280);
      phVar17 = phStack_248;
      iVar2 = phStack_248->block_size;
      if (iVar4 != iVar2) goto LAB_001048ad;
      uVar10 = EVP_MD_CTX_get0_md(ctx_00);
      iVar4 = EVP_MD_get_size(uVar10);
      sVar14 = phVar17->outsize;
      if (sVar14 != (long)iVar4) goto LAB_00104895;
      uVar10 = EVP_MD_CTX_get0_md(ctx_00);
      iVar4 = EVP_MD_get_block_size(uVar10);
      if (iVar4 != iVar2) goto LAB_0010487d;
      pvStack_250 = pvVar12;
      uVar3 = EVP_MD_get_size(pEStack_280);
      uVar15 = (ulong)uVar3;
      if (sVar14 != uVar15) goto LAB_00104865;
      pvVar12 = (void *)CRYPTO_zalloc((int)uVar22 + uVar3,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
                                      ,0x33a);
      if (pvVar12 == (void *)0x0) goto LAB_0010483e;
      puVar21 = (uchar *)((long)pvVar12 + uVar22);
      uStack_200 = (char *)((ulong)uStack_200 & 0xffffffff00000000);
      do {
        iVar2 = EVP_DigestInit(pEVar9,pEStack_280);
        if (iVar2 == 0) {
LAB_00104688:
          ERR_print_errors_fp(_stderr);
          OPENSSL_die("EVP_DigestInit(ctx, dgst)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
                      ,0x340);
LAB_001046af:
          ERR_print_errors_fp(_stderr);
          OPENSSL_die("EVP_DigestFinal(ctx, md, NULL)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
                      ,0x342);
          goto LAB_001046d6;
        }
        iVar2 = EVP_DigestUpdate(pEVar9,(void *)((long)d +
                                                (0x100 - ((ulong)uStack_200 & 0xffffffff))),
                                 (ulong)uStack_200 & 0xffffffff);
        if (iVar2 == 0) {
          ERR_print_errors_fp(_stderr);
          OPENSSL_die("EVP_DigestUpdate(ctx, ibuf + shifts + SUPER_SIZE - len, len)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
                      ,0x341);
LAB_00104661:
          ERR_print_errors_fp(_stderr);
          OPENSSL_die("EVP_DigestUpdate(ctx2, md, mdlen)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
                      ,0x343);
          goto LAB_00104688;
        }
        iVar2 = EVP_DigestFinal(pEVar9,puVar21,(uint *)0x0);
        if (iVar2 == 0) goto LAB_001046af;
        iVar2 = EVP_DigestUpdate(ctx_00,puVar21,uVar15);
        if (iVar2 == 0) goto LAB_00104661;
        uVar13 = (uint)uStack_200 + 1;
        uStack_200 = (char *)CONCAT44(uStack_200._4_4_,uVar13);
      } while (uVar13 < 0x100);
      uStack_200 = (char *)((ulong)uStack_200._4_4_ << 0x20);
      do {
        iVar2 = EVP_DigestInit(pEVar9,pEStack_280);
        if (iVar2 == 0) goto LAB_001046fd;
        iVar2 = EVP_DigestUpdate(pEVar9,d,(ulong)uStack_200 & 0xffffffff);
        if (iVar2 == 0) goto LAB_00104724;
        iVar2 = EVP_DigestFinal(pEVar9,puVar21,(uint *)0x0);
        if (iVar2 == 0) goto LAB_001046d6;
        iVar2 = EVP_DigestUpdate(ctx_00,puVar21,uVar15);
        if (iVar2 == 0) goto LAB_0010474b;
        uVar13 = (uint)uStack_200 + 1;
        uStack_200 = (char *)CONCAT44(uStack_200._4_4_,uVar13);
      } while (uVar13 < 0x100);
      CRYPTO_free(pvStack_250);
      EVP_MD_CTX_free(pEVar9);
      iVar2 = EVP_DigestFinal(ctx_00,puVar21,(uint *)&uStack_200);
      if (iVar2 == 0) goto LAB_001048c5;
      EVP_MD_CTX_free(ctx_00);
      EVP_MD_free(pEStack_280);
      phVar17 = phStack_248;
      if ((uint)uStack_200 == uVar3) {
        iVar2 = bcmp(puVar21,phStack_248->digest,uVar15);
        if (iVar2 != 0) {
          puts("\x1b[1;31mdigest mismatch\x1b[m");
          printf("  Expected value is: ");
          if (uVar15 != 0) {
            uVar16 = 0;
            do {
              printf("\\x%02x",(ulong)puVar21[uVar16]);
              uVar16 = uVar16 + 1;
            } while (uVar15 != uVar16);
          }
          putchar(10);
          goto LAB_0010455d;
        }
        CRYPTO_free(pvVar12);
        bVar1 = true;
      }
      else {
        printf("\x1b[1;31mdigest output len mismatch %u != %u (expected)\x1b[m\n",
               (ulong)uStack_200 & 0xffffffff,(ulong)uVar3);
        phVar17 = phStack_248;
LAB_0010455d:
        CRYPTO_free(pvVar12);
        EVP_MD_free(pEStack_280);
        bVar1 = false;
      }
    } while ((uVar22 < 0xf) && (uVar22 = uVar22 + 1, bVar1));
    if (bVar1) {
      pcVar20 = "\x1b[1;32msuccess\x1b[m";
    }
    else {
      pcVar20 = "\x1b[1;31mfail\x1b[m";
    }
    puts(pcVar20);
LAB_001045c9:
    pcVar20 = phVar17[1].algname;
    phVar17 = phVar17 + 1;
    if (pcVar20 == (char *)0x0) {
      warn_all_untested();
      pcVar20 = "\x1b[0;31m= Some tests FAILED!\x1b[m";
      if (uStack_238 == 0) {
        pcVar20 = "\x1b[0;32m= All tests passed!\x1b[m";
      }
      puts(pcVar20);
      return;
    }
  }
  ERR_set_mark();
  pEStack_278 = EVP_get_digestbyname(pcVar20);
  if ((pEStack_278 == (EVP_MD *)0x0) &&
     (pEStack_278 = (EVP_MD *)EVP_MD_fetch(0,pcVar20,0), pEStack_278 == (EVP_MD *)0x0)) {
    lStack_240 = EVP_MAC_fetch(0,pcVar20,0);
    if (lStack_240 == 0) goto LAB_00104f52;
    pEStack_278 = (EVP_MD *)0x0;
  }
  else {
    lStack_240 = 0;
  }
  ERR_pop_to_mark();
  printf("\x1b[1;34mTest %s: %s: \x1b[m",pcVar20,phVar17->name);
  __n = (size_t)phVar17->psize;
  pvStack_228 = CRYPTO_malloc(phVar17->psize + 0x20,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
                              ,0x2fb);
  if (pvStack_228 != (void *)0x0) {
    piStack_210 = &phVar17->acpkm_t;
    uVar22 = 0;
    do {
      puVar21 = (uchar *)((long)pvStack_228 + uVar22);
      memcpy(puVar21,pcStack_208,__n);
      if (lStack_240 == 0) {
        uVar3 = 0;
      }
      else {
        if (uVar22 == 0) {
          printf("[MAC %zu] ");
        }
        iVar2 = phVar17->acpkm;
        lStack_218 = (long)phVar17->acpkm_t;
        __s = (char **)auStack_100;
        sStack_258 = (long)iVar2;
        memset(__s,0,0xa0);
        if ((long)iVar2 != 0) {
          OSSL_PARAM_construct_size_t(auStack_100,"key-mesh",&sStack_258);
          __s = &pcStack_d8;
          if (lStack_218 != 0) {
            OSSL_PARAM_construct_size_t(&uStack_200,"cipher-key-mesh",&lStack_218);
            pcStack_b8 = pcStack_1e0;
            uStack_d0 = CONCAT44(uStack_1f4,uStack_1f8);
            pcStack_c8 = pcStack_1f0;
            pcStack_c0 = pcStack_1e8;
            pcStack_d8 = uStack_200;
            __s = apcStack_b0;
          }
        }
        lVar7 = EVP_MAC_CTX_new(lStack_240);
        if (lVar7 == 0) goto LAB_001049fd;
        sVar14 = phVar17->outsize;
        if ((sVar14 != 0) && (sVar8 = EVP_MAC_CTX_get_mac_size(lVar7), sVar8 != sVar14))
        goto LAB_00104bd1;
        iVar2 = phVar17->truncate;
        if ((long)iVar2 == 0) {
          uStack_260 = EVP_MAC_CTX_get_mac_size(lVar7);
        }
        else {
          uStack_260 = (long)iVar2;
          OSSL_PARAM_construct_size_t(&uStack_200,"size",&uStack_260);
          __s[4] = pcStack_1e0;
          __s[2] = pcStack_1f0;
          __s[3] = pcStack_1e8;
          *(uint *)__s = (uint)uStack_200;
          *(uint *)((long)__s + 4) = uStack_200._4_4_;
          *(uint *)(__s + 1) = uStack_1f8;
          *(uint *)((long)__s + 0xc) = uStack_1f4;
        }
        iVar4 = EVP_MAC_init(lVar7,phVar17->key,(long)phVar17->key_size,0);
        if (iVar4 == 0) goto LAB_00104a99;
        iVar4 = EVP_MAC_CTX_set_params(lVar7,auStack_100);
        if (iVar4 == 0) goto LAB_00104a72;
        iVar4 = EVP_MAC_update(lVar7,puVar21,__n);
        if (iVar4 == 0) goto LAB_00104a4b;
        uStack_230 = 0;
        if (iVar2 == 0) {
          uVar15 = EVP_MAC_CTX_get_mac_size(lVar7);
          if (uVar15 != uStack_260) goto LAB_00104d57;
          iVar2 = EVP_MAC_final(lVar7,&uStack_200,&uStack_230);
          if (iVar2 == 0) goto LAB_00104d7e;
        }
        else {
          if (0x100 < uStack_260) goto LAB_00104c6d;
          iVar2 = EVP_MAC_finalXOF(lVar7,&uStack_200);
          if (iVar2 == 0) goto LAB_00104c94;
          uStack_230 = uStack_260;
        }
        EVP_MAC_CTX_free(lVar7);
        uVar15 = uStack_260;
        if (uStack_230 != uStack_260) goto LAB_00104a24;
        pcVar23 = phVar17->digest;
        iVar2 = bcmp(&uStack_200,pcVar23,uStack_260);
        if (iVar2 != 0) {
          printf("\x1b[1;31mmac mismatch (iter %d, outsize %d)\x1b[m\n",uVar22 & 0xffffffff,
                 uVar15 & 0xffffffff);
          hexdump(pcVar23,uStack_260);
          hexdump(&uStack_200,uStack_260);
        }
        uVar3 = (uint)(iVar2 != 0);
      }
      if (pEStack_278 != (EVP_MD *)0x0) {
        pcVar23 = phVar17->hmac;
        pvStack_250 = (void *)CONCAT44(pvStack_250._4_4_,uVar3);
        if (pcVar23 == (char *)0x0) {
          if (uVar22 == 0) {
            printf("[MD %zu] ",phVar17->outsize);
          }
          sVar14 = phVar17->outsize;
          if ((sVar14 != 0) && (iVar2 = EVP_MD_get_size(pEStack_278), sVar14 != (long)iVar2))
          goto LAB_00104e41;
          uVar13 = phVar17->truncate;
          if (uVar13 == 0) {
            uVar13 = EVP_MD_get_size(pEStack_278);
          }
          iVar2 = phVar17->block_size;
          if ((iVar2 != 0) && (iVar4 = EVP_MD_get_block_size(pEStack_278), iVar4 != iVar2))
          goto LAB_00104e1a;
          pEVar9 = (EVP_MD_CTX *)EVP_MD_CTX_new();
          if (pEVar9 == (EVP_MD_CTX *)0x0) goto LAB_00104dcc;
          iVar2 = EVP_MD_CTX_reset(pEVar9);
          if (iVar2 == 0) goto LAB_00104da5;
          iVar2 = EVP_DigestInit_ex(pEVar9,pEStack_278,(ENGINE *)0x0);
          phVar17 = phStack_248;
          if (iVar2 == 0) goto LAB_00104df3;
          if ((phStack_248->key != (char *)0x0) &&
             (iVar2 = EVP_MD_CTX_ctrl(pEVar9,0x1004,phStack_248->key_size), iVar2 == 0))
          goto LAB_00104e8f;
          if ((phVar17->acpkm != 0) && (iVar2 = EVP_MD_CTX_ctrl(pEVar9,0x20), iVar2 == 0))
          goto LAB_00104e68;
          iVar2 = EVP_DigestUpdate(pEVar9,puVar21,__n);
          if (iVar2 == 0) goto LAB_00104d30;
          sVar14 = (size_t)(int)uVar13;
          pEVar6 = EVP_MD_CTX_md(pEVar9);
          uVar15 = EVP_MD_get_flags(pEVar6);
          if ((uVar15 & 2) == 0) {
            uVar10 = EVP_MD_CTX_get0_md();
            uVar3 = EVP_MD_get_size(uVar10);
            if (uVar3 != uVar13) goto LAB_00104eb6;
            iVar2 = EVP_DigestFinal_ex(pEVar9,(uchar *)&uStack_200,auStack_100);
            uVar3 = auStack_100[0];
            if (iVar2 == 0) goto LAB_00104edd;
          }
          else {
            iVar2 = EVP_DigestFinalXOF(pEVar9,&uStack_200,sVar14);
            uVar3 = uVar13;
            if (iVar2 == 0) goto LAB_00104f04;
          }
          auStack_100[0] = uVar3;
          EVP_MD_CTX_free(pEVar9);
          if (auStack_100[0] != sVar14) goto LAB_00104d09;
          pcVar23 = phStack_248->digest;
          iVar2 = bcmp(&uStack_200,pcVar23,sVar14);
          uVar3 = (uint)pvStack_250;
          if (iVar2 != 0) {
            printf("\x1b[1;31mdigest mismatch (iter %d, outsize %d)\x1b[m\n",uVar22 & 0xffffffff,
                   (ulong)uVar13);
            hexdump(pcVar23,sVar14);
            hexdump(&uStack_200,sVar14);
          }
          uVar3 = uVar3 | iVar2 != 0;
          phVar17 = phStack_248;
        }
        else {
          pcStack_220 = pcVar23;
          if (uVar22 == 0) {
            printf("[HMAC] ");
          }
          ctx = (HMAC_CTX *)HMAC_CTX_new();
          if (ctx == (HMAC_CTX *)0x0) goto LAB_00104baa;
          pcVar23 = phVar17->key;
          iVar2 = phVar17->key_size;
          iVar4 = HMAC_Init_ex(ctx,pcVar23,iVar2,pEStack_278,(ENGINE *)0x0);
          if (iVar4 == 0) goto LAB_00104b83;
          iVar4 = HMAC_Update(ctx,puVar21,__n);
          if (iVar4 == 0) goto LAB_00104b5c;
          iVar4 = HMAC_Final(ctx,(uchar *)&uStack_200,auStack_100);
          if (iVar4 == 0) goto LAB_00104b35;
          HMAC_CTX_free(ctx);
          pcVar18 = pcStack_220;
          uVar15 = phVar17->outsize;
          if (uVar15 != auStack_100[0] && uVar15 != 0) goto LAB_00104bf8;
          iVar4 = bcmp(&uStack_200,pcStack_220,(ulong)auStack_100[0]);
          if (iVar4 != 0) {
            printf("\x1b[1;31mhmac mismatch (iter %d)\x1b[m\n",uVar22 & 0xffffffff);
            hexdump(pcVar18,(ulong)auStack_100[0]);
            hexdump(&uStack_200,(ulong)auStack_100[0]);
          }
          uStack_234 = (uint)(iVar4 != 0);
          if (uVar22 == 0) {
            printf("[HMAC by EVP_MAC] ");
          }
          lVar7 = EVP_MAC_fetch(0,"HMAC",0);
          if (lVar7 == 0) goto LAB_00104b0e;
          lVar11 = EVP_MAC_CTX_new(lVar7);
          if (lVar11 == 0) goto LAB_00104ae7;
          uStack_200 = "digest";
          uStack_1f8 = 4;
          pcStack_1f0 = (char *)EVP_MD_get0_name(pEStack_278);
          pcStack_1e8 = (char *)0x0;
          pcStack_1e0 = (char *)0xffffffffffffffff;
          uStack_1d8 = 0;
          uStack_1d0 = 0;
          uStack_1c8 = 0;
          uStack_1c0 = 0;
          uStack_1b8 = 0;
          iVar2 = EVP_MAC_init(lVar11,pcVar23,(long)iVar2,&uStack_200);
          if (iVar2 == 0) goto LAB_00104ce2;
          iVar2 = EVP_MAC_update(lVar11,puVar21,__n);
          uVar3 = (uint)pvStack_250;
          if (iVar2 == 0) goto LAB_00104cbb;
          iVar2 = EVP_MAC_final(lVar11,auStack_100,&sStack_258,0x40);
          if (iVar2 == 0) goto LAB_00104c46;
          EVP_MAC_CTX_free(lVar11);
          EVP_MAC_free(lVar7);
          pcVar23 = pcStack_220;
          if (sStack_258 != uVar15 && uVar15 != 0) goto LAB_00104c1f;
          iVar2 = bcmp(auStack_100,pcStack_220,sStack_258);
          phVar17 = phStack_248;
          if (iVar2 != 0) {
            printf("\x1b[1;31mhmac mismatch (iter %d)\x1b[m\n",uVar22 & 0xffffffff);
            hexdump(pcVar23,sStack_258);
            hexdump(auStack_100,sStack_258);
          }
          uVar3 = uVar3 | uStack_234 | iVar2 != 0;
        }
      }
      iVar2 = OBJ_sn2nid(pcVar20);
      pcVar23 = "kuznyechik-cbc";
      if (iVar2 == 0x3f9) {
LAB_00103fe0:
        if (uVar22 == 0) {
          printf("[CMAC(%s)] ",pcVar23);
        }
        pvStack_250 = (void *)CONCAT44(pvStack_250._4_4_,uVar3);
        uVar15 = (ulong)phVar17->truncate;
        if (uVar15 == 0) {
          uVar15 = phVar17->outsize;
        }
        lVar7 = EVP_MAC_fetch(0,"CMAC",0);
        if (lVar7 == 0) goto LAB_00104988;
        lVar11 = EVP_MAC_CTX_new(lVar7);
        if (lVar11 == 0) goto LAB_001048ec;
        uStack_200 = "cipher";
        uStack_1f8 = 4;
        pcStack_1e8 = (char *)0x0;
        pcStack_1e0 = (char *)0xffffffffffffffff;
        uStack_1b8 = 0;
        uStack_1c8 = 0;
        uStack_1c0 = 0;
        uStack_1d8 = 0;
        uStack_1d0 = 0;
        pcStack_1f0 = pcVar23;
        iVar2 = EVP_MAC_CTX_set_params(lVar11,&uStack_200);
        if (iVar2 == 0) goto LAB_00104961;
        iVar2 = EVP_MAC_init(lVar11,phVar17->key,(long)phVar17->key_size,&uStack_200);
        if (iVar2 == 0) goto LAB_00104913;
        iVar2 = EVP_MAC_update(lVar11,puVar21,__n);
        if (iVar2 == 0) goto LAB_001049af;
        iVar2 = EVP_MAC_final(lVar11,auStack_100,&sStack_258);
        if (iVar2 == 0) goto LAB_0010493a;
        EVP_MAC_CTX_free(lVar11);
        EVP_MAC_free(lVar7);
        if (sStack_258 < uVar15) goto LAB_001049d6;
        pcVar23 = phVar17->digest;
        iVar2 = bcmp(auStack_100,pcVar23,uVar15);
        if (iVar2 != 0) {
          printf("\x1b[1;31mcmac mismatch (iter %d)\x1b[m\n",uVar22 & 0xffffffff);
          hexdump(pcVar23,uVar15);
          hexdump(auStack_100,sStack_258);
        }
        uVar13 = (uint)(iVar2 != 0);
        uVar3 = (uint)pvStack_250;
      }
      else {
        uVar13 = 0;
        if (iVar2 == 0x4a8) {
          pcVar23 = "magma-cbc";
          goto LAB_00103fe0;
        }
      }
      uVar13 = uVar13 | uVar3;
      if (uVar13 != 0) goto LAB_00104180;
      uVar22 = uVar22 + 1;
    } while (uVar22 != 0x20);
    uVar13 = 0;
LAB_00104180:
    CRYPTO_free(pvStack_228);
    EVP_MAC_free(lStack_240);
    EVP_MD_free(pEStack_278);
    pcVar20 = "\x1b[1;31mfail\x1b[m";
    if (uVar13 == 0) {
      pcVar20 = "\x1b[1;32msuccess\x1b[m";
    }
    puts(pcVar20);
    uStack_238 = uStack_238 | uVar13;
    goto LAB_001045c9;
  }
LAB_00104f2b:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("buf = OPENSSL_malloc(tv->psize + shifts)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x2fb);
LAB_00104f52:
  ERR_print_errors_fp(_stderr);
  pcVar23 = 
  "(md = (EVP_MD *)EVP_get_digestbyname(tv->algname)) || (md = EVP_MD_fetch(NULL, tv->algname, NULL)) || (mac = EVP_MAC_fetch(NULL, tv->algname, NULL))"
  ;
  pcVar20 = "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c";
  OPENSSL_die("(md = (EVP_MD *)EVP_get_digestbyname(tv->algname)) || (md = EVP_MD_fetch(NULL, tv->algname, NULL)) || (mac = EVP_MAC_fetch(NULL, tv->algname, NULL))"
              ,
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x2f2);
  if (pcVar20 != (char *)0x0) {
    pcVar18 = (char *)0x0;
    do {
      lVar7 = 0;
      do {
        if (pcVar20 <= pcVar18 + lVar7) break;
        pcVar19 = "";
        if (lVar7 == 0) {
          pcVar19 = " ";
        }
        printf("%s%02x",pcVar19,(ulong)(byte)(pcVar23 + (long)pcVar18)[lVar7]);
        lVar7 = lVar7 + 1;
      } while (lVar7 != 0x10);
      pcVar18 = pcVar18 + lVar7;
    } while (pcVar18 < pcVar20);
  }
  putchar(10);
  return;
LAB_001046d6:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("EVP_DigestFinal(ctx, md, NULL)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x34a);
LAB_001046fd:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("EVP_DigestInit(ctx, dgst)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x348);
LAB_00104724:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("EVP_DigestUpdate(ctx, ibuf + shifts, len)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x349);
LAB_0010474b:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("EVP_DigestUpdate(ctx2, md, mdlen)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x34b);
LAB_00104772:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("ibuf = OPENSSL_zalloc(SUPER_SIZE + shifts)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x324);
LAB_00104799:
  OPENSSL_die("assertion failed: EVP_MD_is_a(dgst, tv->algname)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x32e);
LAB_001047b1:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("ctx = EVP_MD_CTX_new()",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x330);
LAB_001047d8:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("ctx2 = EVP_MD_CTX_new()",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x331);
LAB_001047ff:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("EVP_DigestInit(ctx2, dgst)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x332);
LAB_00104826:
  OPENSSL_die("assertion failed: EVP_MD_is_a(EVP_MD_CTX_md(ctx2), tv->algname)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x333);
LAB_0010483e:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("md = OPENSSL_zalloc(mdlen + shifts)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x33a);
LAB_00104865:
  OPENSSL_die("assertion failed: mdlen == tv->outsize",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x339);
LAB_0010487d:
  OPENSSL_die("assertion failed: EVP_MD_CTX_block_size(ctx2) == tv->block_size",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x336);
LAB_00104895:
  OPENSSL_die("assertion failed: EVP_MD_CTX_size(ctx2) == tv->outsize",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x335);
LAB_001048ad:
  OPENSSL_die("assertion failed: EVP_MD_block_size(dgst) == tv->block_size",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x334);
LAB_001048c5:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("EVP_DigestFinal(ctx2, md, &len)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x351);
LAB_001048ec:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("ctx = EVP_MAC_CTX_new(cmac)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x266);
LAB_00104913:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("EVP_MAC_init(ctx, (const unsigned char *)t->key, t->key_size, params)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x26c);
LAB_0010493a:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("EVP_MAC_final(ctx, out, &len, sizeof(out))",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x26e);
LAB_00104961:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("EVP_MAC_CTX_set_params(ctx, params)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x26b);
LAB_00104988:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("cmac = EVP_MAC_fetch(NULL, \"CMAC\", NULL)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x264);
LAB_001049af:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("EVP_MAC_update(ctx, (unsigned char *)plaintext, t->psize)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x26d);
LAB_001049d6:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("outsize <= len",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x274);
LAB_001049fd:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("ctx = EVP_MAC_CTX_new(mac)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x290);
LAB_00104a24:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("len == outsize",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x2ab);
LAB_00104a4b:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("EVP_MAC_update(ctx, (unsigned char *)plaintext, t->psize)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x29d);
LAB_00104a72:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("EVP_MAC_CTX_set_params(ctx, params)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x29c);
LAB_00104a99:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("EVP_MAC_init(ctx, (const unsigned char *)t->key, t->key_size, NULL)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x29b);
LAB_00104ac0:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("(dgst = (EVP_MD *)EVP_get_digestbyname(tv->algname)) || (dgst = EVP_MD_fetch(NULL, tv->algname, NULL))"
              ,
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x32d);
LAB_00104ae7:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("ctx = EVP_MAC_CTX_new(hmac)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x21c);
LAB_00104b0e:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("hmac = EVP_MAC_fetch(NULL, \"HMAC\", NULL)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x21a);
LAB_00104b35:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("HMAC_Final(ctx, md, &len)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x202);
LAB_00104b5c:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("HMAC_Update(ctx, (const unsigned char *)plaintext, t->psize)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x201);
LAB_00104b83:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("HMAC_Init_ex(ctx, t->key, t->key_size, type, NULL)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x200);
LAB_00104baa:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("ctx = HMAC_CTX_new()",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x1ff);
LAB_00104bd1:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("EVP_MAC_CTX_get_mac_size(ctx) == t->outsize",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x292);
LAB_00104bf8:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("len == t->outsize",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x206);
LAB_00104c1f:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("len == t->outsize",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x229);
LAB_00104c46:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("EVP_MAC_final(ctx, out, &len, sizeof(out))",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x224);
LAB_00104c6d:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("outsize <= sizeof(out)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x2a2);
LAB_00104c94:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("EVP_MAC_finalXOF(ctx, out, outsize)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x2a3);
LAB_00104cbb:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("EVP_MAC_update(ctx, (unsigned char *)plaintext, t->psize)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x223);
LAB_00104ce2:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("EVP_MAC_init(ctx, (const unsigned char *)t->key, t->key_size, params)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x222);
LAB_00104d09:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("len == outsize",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x2dd);
LAB_00104d30:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("EVP_DigestUpdate(ctx, plaintext, t->psize)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x2d0);
LAB_00104d57:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("EVP_MAC_CTX_get_mac_size(ctx) == outsize",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x2a6);
LAB_00104d7e:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("EVP_MAC_final(ctx, out, &len, sizeof(out))",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x2a7);
LAB_00104da5:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("EVP_MD_CTX_init(ctx)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x2c8);
LAB_00104dcc:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("ctx = EVP_MD_CTX_new()",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x2c7);
LAB_00104df3:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("EVP_DigestInit_ex(ctx, type, NULL)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x2c9);
LAB_00104e1a:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("EVP_MD_block_size(type) == t->block_size",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x2c5);
LAB_00104e41:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("EVP_MD_size(type) == t->outsize",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x2bd);
LAB_00104e68:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("EVP_MD_CTX_ctrl(ctx, EVP_CTRL_KEY_MESH, t->acpkm, t->acpkm_t? (void *)&t->acpkm_t : NULL)"
              ,
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x2cf);
LAB_00104e8f:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("EVP_MD_CTX_ctrl(ctx, EVP_MD_CTRL_SET_KEY, t->key_size, (void *)t->key)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x2cc);
LAB_00104eb6:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("EVP_MD_CTX_size(ctx) == outsize",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x2d8);
LAB_00104edd:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("EVP_DigestFinal_ex(ctx, out, &len)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x2d9);
LAB_00104f04:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("EVP_DigestFinalXOF(ctx, out, outsize)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x2d5);
  goto LAB_00104f2b;
}

Assistant:

void warn_all_untested(void)
{
    if (engine_is_available("gost")) {
        ENGINE *eng;

        T(eng = ENGINE_by_id("gost"));
        T(ENGINE_init(eng));

        ENGINE_DIGESTS_PTR fn_c;
        T(fn_c = ENGINE_get_digests(eng));
        const int *nids;
        int n, k;
        n = fn_c(eng, NULL, &nids, 0);
        for (k = 0; k < n; ++k)
            warn_if_untested(ENGINE_get_digest(eng, nids[k]), NULL);
        ENGINE_finish(eng);
        ENGINE_free(eng);
    }
    if (OSSL_PROVIDER_available(NULL, "gostprov")) {
        OSSL_PROVIDER *prov;

        T(prov = OSSL_PROVIDER_load(NULL, "gostprov"));
        EVP_MD_do_all_provided(NULL,
                               (void (*)(EVP_MD *, void *))warn_if_untested,
                               prov);

        OSSL_PROVIDER_unload(prov);
    }
}